

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_thread.cpp
# Opt level: O0

void DrawerCommandQueue::ReportDrawerError
               (DrawerCommand *command,bool worker_thread,char *reason,bool fatal)

{
  undefined1 uVar1;
  bool bVar2;
  DrawerCommandQueue *pDVar3;
  char *pcVar4;
  FString local_78;
  FString local_70;
  FString local_68;
  FString local_60;
  FString local_58;
  FString local_50 [3];
  undefined1 local_38 [8];
  unique_lock<std::mutex> end_lock;
  bool fatal_local;
  char *reason_local;
  bool worker_thread_local;
  DrawerCommand *command_local;
  
  end_lock._15_1_ = fatal;
  if (worker_thread) {
    pDVar3 = Instance();
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)local_38,&pDVar3->end_mutex);
    pDVar3 = Instance();
    bVar2 = FString::IsEmpty(&pDVar3->thread_error);
    if ((bVar2) ||
       ((pDVar3 = Instance(), (pDVar3->thread_error_fatal & 1U) == 0 && ((end_lock._15_1_ & 1) != 0)
        ))) {
      FString::FString(&local_60,": ");
      operator+((char *)&local_58,(FString *)reason);
      (*command->_vptr_DrawerCommand[3])(&local_68);
      FString::operator+(local_50,&local_58);
      pDVar3 = Instance();
      FString::operator=(&pDVar3->thread_error,local_50);
      FString::~FString(local_50);
      FString::~FString(&local_68);
      FString::~FString(&local_58);
      FString::~FString(&local_60);
      uVar1 = end_lock._15_1_;
      pDVar3 = Instance();
      pDVar3->thread_error_fatal = (bool)(uVar1 & 1);
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_38);
  }
  else {
    if (fatal) {
      (*command->_vptr_DrawerCommand[3])();
      pcVar4 = FString::GetChars(&local_70);
      I_FatalError("%s: %s",reason,pcVar4);
      FString::~FString(&local_70);
    }
    else if (ReportDrawerError::first) {
      (*command->_vptr_DrawerCommand[3])();
      pcVar4 = FString::GetChars(&local_78);
      Printf("%s: %s\n",reason,pcVar4);
      FString::~FString(&local_78);
    }
    ReportDrawerError::first = false;
  }
  return;
}

Assistant:

void DrawerCommandQueue::ReportDrawerError(DrawerCommand *command, bool worker_thread, const char *reason, bool fatal)
{
	if (worker_thread)
	{
		std::unique_lock<std::mutex> end_lock(Instance()->end_mutex);
		if (Instance()->thread_error.IsEmpty() || (!Instance()->thread_error_fatal && fatal))
		{
			Instance()->thread_error = reason + (FString)": " + command->DebugInfo();
			Instance()->thread_error_fatal = fatal;
		}
	}
	else
	{
		static bool first = true;
		if (fatal)
			I_FatalError("%s: %s", reason, command->DebugInfo().GetChars());
		else if (first)
			Printf("%s: %s\n", reason, command->DebugInfo().GetChars());
		first = false;
	}
}